

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

UtestShell * __thiscall TestRegistry::findTestWithGroup(TestRegistry *this,SimpleString *group)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  SimpleString local_38;
  UtestShell *local_28;
  UtestShell *current;
  SimpleString *group_local;
  TestRegistry *this_local;
  
  local_28 = this->tests_;
  current = (UtestShell *)group;
  group_local = (SimpleString *)this;
  while( true ) {
    if (local_28 == (UtestShell *)0x0) {
      return (UtestShell *)0x0;
    }
    UtestShell::getGroup((UtestShell *)&local_38);
    bVar1 = operator==(&local_38,(SimpleString *)current);
    SimpleString::~SimpleString(&local_38);
    if (bVar1) break;
    iVar2 = (*local_28->_vptr_UtestShell[3])();
    local_28 = (UtestShell *)CONCAT44(extraout_var,iVar2);
  }
  return local_28;
}

Assistant:

UtestShell* TestRegistry::findTestWithGroup(const SimpleString& group)
{
    UtestShell* current = tests_;
    while (current) {
        if (current->getGroup() == group)
            return current;
        current = current->getNext();
    }
    return NULLPTR;
}